

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void down2_symeven(uint8_t *input,int length,uint8_t *output,int start_offset)

{
  uint8_t uVar1;
  int iVar2;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  int sum_3;
  int sum_2;
  int sum_1;
  int sum;
  int l2;
  int l1;
  uint8_t *optr;
  int j;
  int i;
  int filter_len_half;
  int16_t *filter;
  int local_98;
  int local_84;
  int local_78;
  int local_64;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint8_t *local_40;
  int local_34;
  int local_30;
  
  iVar2 = (in_ESI - 4U & 1) + (in_ESI - 4U);
  local_40 = in_RDX;
  local_30 = in_ECX;
  if (iVar2 < 4) {
    for (; local_30 < in_ESI; local_30 = local_30 + 2) {
      local_4c = 0x40;
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        if (local_30 - local_34 < 1) {
          local_64 = 0;
        }
        else {
          local_64 = local_30 - local_34;
        }
        if (local_30 + 1 + local_34 < in_ESI + -1) {
          local_78 = local_30 + 1 + local_34;
        }
        else {
          local_78 = in_ESI + -1;
        }
        local_4c = ((uint)*(byte *)(in_RDI + local_64) + (uint)*(byte *)(in_RDI + local_78)) *
                   (int)av1_down2_symeven_half_filter[local_34] + local_4c;
      }
      uVar1 = clip_pixel(local_4c >> 7);
      *local_40 = uVar1;
      local_40 = local_40 + 1;
    }
  }
  else {
    for (; local_30 < 4; local_30 = local_30 + 2) {
      local_50 = 0x40;
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        if (local_30 - local_34 < 1) {
          local_84 = 0;
        }
        else {
          local_84 = local_30 - local_34;
        }
        local_50 = ((uint)*(byte *)(in_RDI + local_84) +
                   (uint)*(byte *)(in_RDI + (local_30 + 1 + local_34))) *
                   (int)av1_down2_symeven_half_filter[local_34] + local_50;
      }
      uVar1 = clip_pixel(local_50 >> 7);
      *local_40 = uVar1;
      local_40 = local_40 + 1;
    }
    for (; local_30 < iVar2; local_30 = local_30 + 2) {
      local_54 = 0x40;
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        local_54 = ((uint)*(byte *)(in_RDI + (local_30 - local_34)) +
                   (uint)*(byte *)(in_RDI + (local_30 + 1 + local_34))) *
                   (int)av1_down2_symeven_half_filter[local_34] + local_54;
      }
      uVar1 = clip_pixel(local_54 >> 7);
      *local_40 = uVar1;
      local_40 = local_40 + 1;
    }
    for (; local_30 < in_ESI; local_30 = local_30 + 2) {
      local_58 = 0x40;
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        if (local_30 + 1 + local_34 < in_ESI + -1) {
          local_98 = local_30 + 1 + local_34;
        }
        else {
          local_98 = in_ESI + -1;
        }
        local_58 = ((uint)*(byte *)(in_RDI + (local_30 - local_34)) +
                   (uint)*(byte *)(in_RDI + local_98)) *
                   (int)av1_down2_symeven_half_filter[local_34] + local_58;
      }
      uVar1 = clip_pixel(local_58 >> 7);
      *local_40 = uVar1;
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

void down2_symeven(const uint8_t *const input, int length, uint8_t *output,
                   int start_offset) {
  // Actual filter len = 2 * filter_len_half.
  const int16_t *filter = av1_down2_symeven_half_filter;
  const int filter_len_half = sizeof(av1_down2_symeven_half_filter) / 2;
  int i, j;
  uint8_t *optr = output;
  int l1 = filter_len_half;
  int l2 = (length - filter_len_half);
  l1 += (l1 & 1);
  l2 += (l2 & 1);
  if (l1 > l2) {
    // Short input length.
    for (i = start_offset; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum +=
            (input[AOMMAX(i - j, 0)] + input[AOMMIN(i + 1 + j, length - 1)]) *
            filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
  } else {
    // Initial part.
    for (i = start_offset; i < l1; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum += (input[AOMMAX(i - j, 0)] + input[i + 1 + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
    // Middle part.
    for (; i < l2; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum += (input[i - j] + input[i + 1 + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
    // End part.
    for (; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum +=
            (input[i - j] + input[AOMMIN(i + 1 + j, length - 1)]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
  }
}